

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O1

string * __thiscall
license::CryptoHelperLinux::exportPrivateKey_abi_cxx11_
          (string *__return_storage_ptr__,CryptoHelperLinux *this)

{
  ulong *puVar1;
  size_type *psVar2;
  BIO_METHOD *type;
  BIO *bp;
  long lVar3;
  char *data;
  undefined8 *puVar4;
  logic_error *this_00;
  undefined8 uVar5;
  ulong uVar6;
  allocator local_111;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  string local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  if (this->rsa == (RSA *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Export not initialized.Call generateKeyPair first.","");
    std::logic_error::logic_error(this_00,(string *)&local_110);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  type = BIO_s_mem();
  bp = BIO_new(type);
  PEM_write_bio_RSAPrivateKey
            (bp,(RSA *)this->rsa,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
  lVar3 = BIO_ctrl(bp,10,0,(void *)0x0);
  data = (char *)calloc((long)((int)lVar3 + 1),1);
  BIO_read(bp,data,(int)lVar3);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\"","");
  std::__cxx11::string::string((string *)&local_50,data,&local_111);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\\n\" \\\n\"","");
  replaceAll(&local_d0,&local_50,&local_70,&local_90);
  uVar6 = 0xf;
  if (local_b0 != local_a0) {
    uVar6 = local_a0[0];
  }
  if (uVar6 < local_d0._M_string_length + local_a8) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar5 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_d0._M_string_length + local_a8) goto LAB_0010416c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0010416c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_110 = &local_100;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = *(undefined4 *)(puVar4 + 3);
    uStack_f4 = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\"","");
  uVar6 = 0xf;
  if (local_110 != &local_100) {
    uVar6 = local_100;
  }
  if (uVar6 < (ulong)(local_e8 + local_108)) {
    uVar6 = 0xf;
    if (local_f0 != local_e0) {
      uVar6 = local_e0[0];
    }
    if ((ulong)(local_e8 + local_108) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
      goto LAB_00104254;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
LAB_00104254:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar5 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  BIO_free_all(bp);
  free(data);
  return __return_storage_ptr__;
}

Assistant:

const string CryptoHelperLinux::exportPrivateKey() const {
	if (rsa == NULL) {
		throw logic_error(
				string("Export not initialized.Call generateKeyPair first."));
	}
	BIO* bio_private = BIO_new(BIO_s_mem());
	PEM_write_bio_RSAPrivateKey(bio_private, rsa, NULL, NULL, 0, NULL, NULL);
	int keylen = BIO_pending(bio_private);
	char* pem_key = (char*) (calloc(keylen + 1, 1)); /* Null-terminate */
	BIO_read(bio_private, pem_key, keylen);
	string dest = string("\"")
			+ replaceAll(string(pem_key), string("\n"), string("\\n\" \\\n\""))
			+ string("\"");
	BIO_free_all(bio_private);
	free(pem_key);
	return dest;
}